

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O3

Call * __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::Call::Arg<>
          (Call *__return_storage_ptr__,Call *this,string_view format)

{
  bool bVar1;
  pointer pbVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  _Optional_payload_base<int> _Var7;
  size_t sVar8;
  undefined7 uVar9;
  size_t in_R9;
  string_view format_00;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  format_00._M_str = (char *)0x0;
  format_00._M_len = (size_t)format._M_str;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_40,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x0,in_R9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->args,
             &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  sVar3 = (this->var)._M_len;
  pcVar4 = (this->var)._M_str;
  sVar5 = (this->call)._M_len;
  pcVar6 = (this->call)._M_str;
  _Var7 = (this->field_index).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>;
  sVar8 = (this->thiz).
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_len;
  bVar1 = (this->thiz).
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_engaged;
  uVar9 = *(undefined7 *)
           &(this->thiz).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            field_0x11;
  (__return_storage_ptr__->thiz).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str =
       (this->thiz).
       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
       _M_payload.
       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
       _M_payload._M_value._M_str;
  (__return_storage_ptr__->thiz).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       bVar1;
  *(undefined7 *)
   &(__return_storage_ptr__->thiz).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    field_0x11 = uVar9;
  (__return_storage_ptr__->field_index).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var7;
  (__return_storage_ptr__->thiz).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = sVar8;
  (__return_storage_ptr__->call)._M_len = sVar5;
  (__return_storage_ptr__->call)._M_str = pcVar6;
  (__return_storage_ptr__->var)._M_len = sVar3;
  (__return_storage_ptr__->var)._M_str = pcVar4;
  pbVar2 = (this->args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->args).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  pbVar2 = (this->args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = this->suppressed;
  __return_storage_ptr__->suppressed = bVar1;
  return (Call *)CONCAT71((int7)((ulong)pbVar2 >> 8),bVar1);
}

Assistant:

Call Arg(absl::string_view format, const SubArgs&... args) && {
    this->args.emplace_back(absl::Substitute(format, args...));
    return std::move(*this);
  }